

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_worker_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue obj;
  JSRuntime *rt_00;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSWorkerData *worker;
  JSWorkerMessageHandler *in_stack_ffffffffffffffd8;
  
  obj.tag = in_RDX;
  obj.u.ptr = in_RSI.ptr;
  rt_00 = (JSRuntime *)JS_GetOpaque(obj,js_worker_class_id);
  if (rt_00 != (JSRuntime *)0x0) {
    js_free_message_pipe((JSWorkerMessagePipe *)in_RSI.ptr);
    js_free_message_pipe((JSWorkerMessagePipe *)in_RSI.ptr);
    js_free_port(rt_00,in_stack_ffffffffffffffd8);
    js_free_rt(rt_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void js_worker_finalizer(JSRuntime *rt, JSValue val)
{
    JSWorkerData *worker = JS_GetOpaque(val, js_worker_class_id);
    if (worker) {
        js_free_message_pipe(worker->recv_pipe);
        js_free_message_pipe(worker->send_pipe);
        js_free_port(rt, worker->msg_handler);
        js_free_rt(rt, worker);
    }
}